

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

ktx_error_code_e ktxPrintKTX2InfoTextForMemory(ktx_uint8_t *bytes,ktx_size_t size)

{
  ktxStream stream;
  ktx_error_code_e result;
  ktx_size_t in_stack_ffffffffffffff88;
  ktx_uint8_t *in_stack_ffffffffffffff90;
  ktxStream *in_stack_ffffffffffffff98;
  ktxStream *in_stack_ffffffffffffffd8;
  undefined4 local_14;
  
  local_14 = ktxMemStream_construct_ro
                       (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                        in_stack_ffffffffffffff88);
  if (local_14 == KTX_SUCCESS) {
    local_14 = ktxPrintKTX2InfoTextForStream(in_stack_ffffffffffffffd8);
  }
  return local_14;
}

Assistant:

KTX_error_code
ktxPrintKTX2InfoTextForMemory(const ktx_uint8_t* bytes, ktx_size_t size)
{
    KTX_error_code result;
    ktxStream stream;

    result = ktxMemStream_construct_ro(&stream, bytes, size);
    if (result == KTX_SUCCESS)
        result = ktxPrintKTX2InfoTextForStream(&stream);
    return result;
}